

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_measures.cc
# Opt level: O3

S2Point * S2::GetCentroid(S2Point *__return_storage_ptr__,S2ShapeIndex *index)

{
  int iVar1;
  int iVar2;
  S2Shape *shape;
  uint uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double local_60;
  double local_58;
  double dStack_50;
  S2Point local_48;
  undefined4 extraout_var;
  
  iVar1 = GetDimension(index);
  local_58 = 0.0;
  dStack_50 = 0.0;
  __return_storage_ptr__->c_[1] = 0.0;
  __return_storage_ptr__->c_[2] = 0.0;
  iVar2 = (*index->_vptr_S2ShapeIndex[2])(index);
  uVar5 = 0;
  uVar6 = 0;
  if (0 < iVar2) {
    local_60 = 0.0;
    uVar4 = 0;
    do {
      iVar2 = (*index->_vptr_S2ShapeIndex[3])(index,uVar4);
      shape = (S2Shape *)CONCAT44(extraout_var,iVar2);
      if (shape != (S2Shape *)0x0) {
        iVar2 = (*shape->_vptr_S2Shape[4])(shape);
        if (iVar2 == iVar1) {
          GetCentroid(&local_48,shape);
          local_60 = local_60 + local_48.c_[0];
          local_58 = local_58 + local_48.c_[1];
          dStack_50 = dStack_50 + local_48.c_[2];
        }
      }
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
      iVar2 = (*index->_vptr_S2ShapeIndex[2])(index);
    } while ((int)uVar3 < iVar2);
    __return_storage_ptr__->c_[1] = local_58;
    __return_storage_ptr__->c_[2] = dStack_50;
    uVar5 = SUB84(local_60,0);
    uVar6 = (undefined4)((ulong)local_60 >> 0x20);
  }
  __return_storage_ptr__->c_[0] = (VType)CONCAT44(uVar6,uVar5);
  return __return_storage_ptr__;
}

Assistant:

S2Point GetCentroid(const S2ShapeIndex& index) {
  int dim = GetDimension(index);
  S2Point centroid;
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    S2Shape* shape = index.shape(i);
    if (shape && shape->dimension() == dim) {
      centroid += S2::GetCentroid(*shape);
    }
  }
  return centroid;
}